

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

void __thiscall Texture::loadTexture(Texture *this,string *imagePath)

{
  GLuint GVar1;
  ResourceManager *pRVar2;
  char *filename;
  ostream *poVar3;
  string local_80 [32];
  uchar *local_60;
  uchar *image;
  int height;
  int width;
  GLuint texture_id;
  string local_40 [39];
  bool local_19;
  string *psStack_18;
  bool succes;
  string *imagePath_local;
  Texture *this_local;
  
  local_19 = false;
  psStack_18 = imagePath;
  imagePath_local = (string *)this;
  pRVar2 = ResourceManager::getInstance();
  std::__cxx11::string::string(local_40,(string *)imagePath);
  GVar1 = ResourceManager::getTexture(pRVar2,(string *)local_40,&local_19);
  this->textureBuffer = GVar1;
  std::__cxx11::string::~string(local_40);
  if ((local_19 & 1U) == 0) {
    glEnable(0xde1);
    glGenTextures(1,&height);
    glBindTexture(0xde1,height);
    filename = (char *)std::__cxx11::string::c_str();
    local_60 = SOIL_load_image(filename,(int *)((long)&image + 4),(int *)&image,(int *)0x0,4);
    glTexImage2D(0xde1,0,0x1908,image._4_4_,(int)image,0,0x1908,0x1401,local_60);
    glTexParameteri(0xde1,0x2802,0x2901);
    glTexParameteri(0xde1,0x2803,0x2901);
    glTexParameteri(0xde1,0x2800,0x2601);
    glTexParameteri(0xde1,0x2801,0x2703);
    (*__glewGenerateMipmap)(0xde1);
    poVar3 = std::operator<<((ostream *)&std::cout,"Width: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,image._4_4_);
    poVar3 = std::operator<<(poVar3,", Height: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)image);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Image ID: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,height);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    SOIL_free_image_data(local_60);
    if (height == -1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Failed loading: ");
      poVar3 = std::operator<<(poVar3,(string *)imagePath);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    this->textureBuffer = height;
    pRVar2 = ResourceManager::getInstance();
    std::__cxx11::string::string(local_80,(string *)imagePath);
    ResourceManager::addTexture(pRVar2,height,(string *)local_80);
    std::__cxx11::string::~string(local_80);
  }
  return;
}

Assistant:

void Texture::loadTexture(std::string imagePath)
{
	bool succes = false;
	this->textureBuffer = ResourceManager::getInstance()->getTexture(imagePath, succes);
	if (succes)
	{
		return;
	}
	glEnable(GL_TEXTURE_2D);

	GLuint texture_id;
	glGenTextures(1, &texture_id);
	glBindTexture(GL_TEXTURE_2D, texture_id);
	int width;
	int height;
	unsigned char* image = SOIL_load_image(imagePath.c_str(), &width, &height, 0, SOIL_LOAD_RGBA);
	glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, image);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
	glGenerateMipmap(GL_TEXTURE_2D);


	std::cout << "Width: " << width << ", Height: " << height << std::endl;
	std::cout << "Image ID: " << texture_id << std::endl;

	SOIL_free_image_data(image);

	if (texture_id == -1)
	{
		std::cout << "Failed loading: " << imagePath << std::endl;
	}
	
	textureBuffer = texture_id;
	ResourceManager::getInstance()->addTexture(texture_id, imagePath);
}